

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoSimdBitSelect(Thread *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  unsigned_long *puVar5;
  byte local_51;
  undefined1 auStack_50 [7];
  u8 i;
  S result;
  Simd<unsigned_long,_(unsigned_char)__x02_> lhs;
  Simd<unsigned_long,_(unsigned_char)__x02_> rhs;
  Simd<unsigned_long,_(unsigned_char)__x02_> c;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  for (local_51 = 0; local_51 < 2; local_51 = local_51 + 1) {
    puVar5 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<unsigned_long,_(unsigned_char)__x02_> *)(result.v + 1),local_51);
    uVar1 = *puVar5;
    puVar5 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<unsigned_long,_(unsigned_char)__x02_> *)(rhs.v + 1),local_51);
    uVar2 = *puVar5;
    puVar5 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<unsigned_long,_(unsigned_char)__x02_> *)(lhs.v + 1),local_51);
    uVar3 = *puVar5;
    puVar5 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<unsigned_long,_(unsigned_char)__x02_> *)(rhs.v + 1),local_51);
    uVar4 = *puVar5;
    puVar5 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<unsigned_long,_(unsigned_char)__x02_> *)auStack_50,local_51);
    *puVar5 = uVar1 & uVar2 | uVar3 & (uVar4 ^ 0xffffffffffffffff);
  }
  value.v[1] = result.v[0];
  value.v[0] = _auStack_50;
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitSelect() {
  using S = u64x2;
  auto c = Pop<S>();
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = (lhs[i] & c[i]) | (rhs[i] & ~c[i]);
  }
  Push(result);
  return RunResult::Ok;
}